

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

void __thiscall L12_1::String::String(String *this,String *s)

{
  int iVar1;
  int iVar2;
  char *__dest;
  
  iVar1 = s->_length;
  this->_length = iVar1;
  iVar2 = -1;
  if (-2 < iVar1) {
    iVar2 = iVar1 + 1;
  }
  __dest = (char *)operator_new__((long)iVar2);
  this->_p_str = __dest;
  strcpy(__dest,s->_p_str);
  std::operator<<((ostream *)&std::cout,"init from another String...");
}

Assistant:

String::String(const String & s) {
        _length = s.length();
        _p_str = new char[_length + 1];
        std::strcpy(_p_str, s._p_str);

        std::cout << "init from another String...";
        num_strings++;
    }